

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O0

void __thiscall Fl_Shared_Image::add(Fl_Shared_Image *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Fl_Shared_Image **__dest;
  Fl_Shared_Image **temp;
  Fl_Shared_Image *this_local;
  
  if (alloc_images_ <= num_images_) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(alloc_images_ + 0x20);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    __dest = (Fl_Shared_Image **)operator_new__(uVar2);
    if ((alloc_images_ != 0) &&
       (memcpy(__dest,images_,(long)alloc_images_ << 3), images_ != (Fl_Shared_Image **)0x0)) {
      operator_delete__(images_);
    }
    alloc_images_ = alloc_images_ + 0x20;
    images_ = __dest;
  }
  images_[num_images_] = this;
  num_images_ = num_images_ + 1;
  if (1 < num_images_) {
    qsort(images_,(long)num_images_,8,compare);
  }
  return;
}

Assistant:

void
Fl_Shared_Image::add() {
  Fl_Shared_Image	**temp;		// New image pointer array...

  if (num_images_ >= alloc_images_) {
    // Allocate more memory...
    temp = new Fl_Shared_Image *[alloc_images_ + 32];

    if (alloc_images_) {
      memcpy(temp, images_, alloc_images_ * sizeof(Fl_Shared_Image *));

      delete[] images_;
    }

    images_       = temp;
    alloc_images_ += 32;
  }

  images_[num_images_] = this;
  num_images_ ++;

  if (num_images_ > 1) {
    qsort(images_, num_images_, sizeof(Fl_Shared_Image *),
          (compare_func_t)compare);
  }
}